

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O2

int KINSetLinearSolver(void *kinmem,SUNLinearSolver LS,SUNMatrix A)

{
  long lVar1;
  int iVar2;
  void *__ptr;
  SUNLinearSolver_Ops p_Var3;
  SUNMatrix p_Var4;
  int line;
  SUNMatrix p_Var5;
  char *pcVar6;
  
  if (kinmem == (void *)0x0) {
    pcVar6 = "KINSOL memory is NULL.";
    iVar2 = -1;
    line = 0x36;
  }
  else {
    if (LS != (SUNLinearSolver)0x0) {
      if ((LS->ops->gettype == (_func_SUNLinearSolver_Type_SUNLinearSolver *)0x0) ||
         (LS->ops->solve == (_func_int_SUNLinearSolver_SUNMatrix_N_Vector_N_Vector_sunrealtype *)0x0
         )) {
        pcVar6 = "LS object is missing a required operation";
        line = 0x45;
      }
      else {
        iVar2 = SUNLinSolGetType(LS);
        if (iVar2 == 3) {
          pcVar6 = "KINSOL is incompatible with MATRIX_EMBEDDED LS objects";
          line = 0x50;
        }
        else {
          lVar1 = *(long *)(*(long *)((long)kinmem + 0x148) + 8);
          if ((*(long *)(lVar1 + 0x60) == 0) || (*(long *)(lVar1 + 0x98) == 0)) {
            pcVar6 = "A required vector operation is not implemented.";
            line = 0x5d;
          }
          else if (iVar2 == 0) {
            if (A != (SUNMatrix)0x0) goto LAB_0010f032;
            pcVar6 = "Incompatible inputs: direct LS requires non-NULL matrix";
            line = 0x7d;
          }
          else {
            if ((LS->ops->setscalingvectors !=
                 (_func_SUNErrCode_SUNLinearSolver_N_Vector_N_Vector *)0x0) ||
               (*(long *)(lVar1 + 0x48) != 0)) {
              if (iVar2 == 1) {
                if (LS->ops->setatimes ==
                    (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
                  pcVar6 = "Incompatible inputs: iterative LS must support ATimes routine";
                  line = 0x6f;
                  goto LAB_0010ef47;
                }
              }
              else if (A == (SUNMatrix)0x0) {
                pcVar6 = "Incompatible inputs: matrix-iterative LS requires non-NULL matrix";
                line = 0x76;
                goto LAB_0010ef47;
              }
LAB_0010f032:
              if (*(code **)((long)kinmem + 0x238) != (code *)0x0) {
                (**(code **)((long)kinmem + 0x238))(kinmem);
              }
              *(uint *)((long)kinmem + 0x240) = (uint)(iVar2 != 0);
              *(code **)((long)kinmem + 0x220) = kinLsInitialize;
              *(code **)((long)kinmem + 0x228) = kinLsSetup;
              *(code **)((long)kinmem + 0x230) = kinLsSolve;
              *(code **)((long)kinmem + 0x238) = kinLsFree;
              __ptr = calloc(1,0xb8);
              if (__ptr != (void *)0x0) {
                *(SUNLinearSolver *)((long)__ptr + 0x20) = LS;
                p_Var4 = A;
                p_Var5 = A;
                if (A != (SUNMatrix)0x0) {
                  p_Var4 = (SUNMatrix)kinLsDQJac;
                  p_Var5 = (SUNMatrix)kinmem;
                }
                *(uint *)((long)__ptr + 8) = (uint)(A != (SUNMatrix)0x0);
                *(SUNMatrix *)((long)__ptr + 0x10) = p_Var4;
                *(SUNMatrix *)((long)__ptr + 0x18) = p_Var5;
                *(undefined4 *)((long)__ptr + 0x98) = 1;
                *(code **)((long)__ptr + 0xa0) = kinLsDQJtimes;
                *(undefined8 *)((long)__ptr + 0xa8) = *(undefined8 *)((long)kinmem + 0x10);
                *(void **)((long)__ptr + 0xb0) = kinmem;
                *(undefined8 *)((long)__ptr + 0x88) = 0;
                *(undefined8 *)((long)__ptr + 0x78) = 0;
                *(undefined8 *)((long)__ptr + 0x80) = 0;
                *(undefined8 *)((long)__ptr + 0x90) = *(undefined8 *)((long)kinmem + 0x18);
                *(undefined8 *)((long)__ptr + 0x38) = 0;
                *(undefined8 *)((long)__ptr + 0x40) = 0;
                *(undefined8 *)((long)__ptr + 0x48) = 0;
                *(undefined8 *)((long)__ptr + 0x50) = 0;
                *(undefined8 *)((long)__ptr + 0x68) = 0;
                *(undefined8 *)((long)__ptr + 0x58) = 0;
                *(undefined8 *)((long)__ptr + 0x60) = 0;
                *(undefined4 *)((long)__ptr + 0x74) = 0;
                p_Var3 = LS->ops;
                if (p_Var3->setatimes !=
                    (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
                  iVar2 = SUNLinSolSetATimes(LS,kinmem,kinLsATimes);
                  if (iVar2 != 0) {
                    pcVar6 = "Error in calling SUNLinSolSetATimes";
                    iVar2 = 0xc0;
                    goto LAB_0010f22b;
                  }
                  p_Var3 = LS->ops;
                }
                if ((p_Var3->setpreconditioner ==
                     (_func_SUNErrCode_SUNLinearSolver_void_ptr_SUNPSetupFn_SUNPSolveFn *)0x0) ||
                   (iVar2 = SUNLinSolSetPreconditioner(LS,kinmem,0,0), iVar2 == 0)) {
                  *(undefined8 *)((long)__ptr + 0x30) = 0xbff0000000000000;
                  *(SUNMatrix *)((long)__ptr + 0x28) = A;
                  *(void **)((long)kinmem + 0x248) = __ptr;
                  return 0;
                }
                pcVar6 = "Error in calling SUNLinSolSetPreconditioner";
                iVar2 = 0xce;
LAB_0010f22b:
                KINProcessError((KINMem)kinmem,-8,iVar2,"KINSetLinearSolver",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                                ,pcVar6);
                free(__ptr);
                return -8;
              }
              pcVar6 = "A memory request failed.";
              iVar2 = -4;
              line = 0x93;
              goto LAB_0010ef6c;
            }
            pcVar6 = "A required vector operation is not implemented.";
            line = 0x68;
          }
        }
      }
LAB_0010ef47:
      iVar2 = -3;
      goto LAB_0010ef6c;
    }
    pcVar6 = "LS must be non-NULL";
    iVar2 = -3;
    line = 0x3c;
  }
  kinmem = (KINMem)0x0;
LAB_0010ef6c:
  KINProcessError((KINMem)kinmem,iVar2,line,"KINSetLinearSolver",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/kinsol/kinsol_ls.c"
                  ,pcVar6);
  return iVar2;
}

Assistant:

int KINSetLinearSolver(void* kinmem, SUNLinearSolver LS, SUNMatrix A)
{
  KINMem kin_mem;
  KINLsMem kinls_mem;
  int retval, LSType;
  sunbooleantype iterative;   /* is the solver iterative?    */
  sunbooleantype matrixbased; /* is a matrix structure used? */

  /* Return immediately if either kinmem or LS inputs are NULL */
  if (kinmem == NULL)
  {
    KINProcessError(NULL, KINLS_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_LS_KINMEM_NULL);
    return (KINLS_MEM_NULL);
  }
  if (LS == NULL)
  {
    KINProcessError(NULL, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "LS must be non-NULL");
    return (KINLS_ILL_INPUT);
  }
  kin_mem = (KINMem)kinmem;

  /* Test if solver is compatible with LS interface */
  if ((LS->ops->gettype == NULL) || (LS->ops->solve == NULL))
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "LS object is missing a required operation");
    return (KINLS_ILL_INPUT);
  }

  /* Retrieve the LS type */
  LSType = SUNLinSolGetType(LS);

  /* Return with error if LS has 'matrix-embedded' type */
  if (LSType == SUNLINEARSOLVER_MATRIX_EMBEDDED)
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "KINSOL is incompatible with MATRIX_EMBEDDED LS objects");
    return (KINLS_ILL_INPUT);
  }

  /* Set flags based on LS type */
  iterative   = (LSType != SUNLINEARSOLVER_DIRECT);
  matrixbased = (LSType != SUNLINEARSOLVER_ITERATIVE);

  /* check for required vector operations for KINLS interface */
  if ((kin_mem->kin_vtemp1->ops->nvconst == NULL) ||
      (kin_mem->kin_vtemp1->ops->nvdotprod == NULL))
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_LS_BAD_NVECTOR);
    return (KINLS_ILL_INPUT);
  }

  /* Check for compatible LS type, matrix and "atimes" support */
  if (iterative)
  {
    if ((LS->ops->setscalingvectors == NULL) &&
        (kin_mem->kin_vtemp1->ops->nvgetlength == NULL))
    {
      KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_LS_BAD_NVECTOR);
      return (KINLS_ILL_INPUT);
    }

    if (!matrixbased && (LS->ops->setatimes == NULL))
    {
      KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Incompatible inputs: iterative LS must support ATimes routine");
      return (KINLS_ILL_INPUT);
    }

    if (matrixbased && A == NULL)
    {
      KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__,
                      __FILE__, "Incompatible inputs: matrix-iterative LS requires non-NULL matrix");
      return (KINLS_ILL_INPUT);
    }
  }
  else if (A == NULL)
  {
    KINProcessError(kin_mem, KINLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Incompatible inputs: direct LS requires non-NULL matrix");
    return (KINLS_ILL_INPUT);
  }

  /* free any existing system solver attached to KIN */
  if (kin_mem->kin_lfree) { kin_mem->kin_lfree(kin_mem); }

  /* Determine if this is an iterative linear solver */
  kin_mem->kin_inexact_ls = iterative;

  /* Set four main system linear solver function fields in kin_mem */
  kin_mem->kin_linit  = kinLsInitialize;
  kin_mem->kin_lsetup = kinLsSetup;
  kin_mem->kin_lsolve = kinLsSolve;
  kin_mem->kin_lfree  = kinLsFree;

  /* Get memory for KINLsMemRec */
  kinls_mem = NULL;
  kinls_mem = (KINLsMem)malloc(sizeof(struct KINLsMemRec));
  if (kinls_mem == NULL)
  {
    KINProcessError(kin_mem, KINLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LS_MEM_FAIL);
    return (KINLS_MEM_FAIL);
  }
  memset(kinls_mem, 0, sizeof(struct KINLsMemRec));

  /* set SUNLinearSolver pointer */
  kinls_mem->LS = LS;

  /* Set defaults for Jacobian-related fields */
  if (A != NULL)
  {
    kinls_mem->jacDQ  = SUNTRUE;
    kinls_mem->jac    = kinLsDQJac;
    kinls_mem->J_data = kin_mem;
  }
  else
  {
    kinls_mem->jacDQ  = SUNFALSE;
    kinls_mem->jac    = NULL;
    kinls_mem->J_data = NULL;
  }
  kinls_mem->jtimesDQ = SUNTRUE;
  kinls_mem->jtimes   = kinLsDQJtimes;
  kinls_mem->jt_func  = kin_mem->kin_func;
  kinls_mem->jt_data  = kin_mem;

  /* Set defaults for preconditioner-related fields */
  kinls_mem->pset   = NULL;
  kinls_mem->psolve = NULL;
  kinls_mem->pfree  = NULL;
  kinls_mem->pdata  = kin_mem->kin_user_data;

  /* Initialize counters */
  kinLsInitializeCounters(kinls_mem);

  /* Set default values for the rest of the LS parameters */
  kinls_mem->last_flag = KINLS_SUCCESS;

  /* If LS supports ATimes, attach KINLs routine */
  if (LS->ops->setatimes)
  {
    retval = SUNLinSolSetATimes(LS, kin_mem, kinLsATimes);
    if (retval != SUN_SUCCESS)
    {
      KINProcessError(kin_mem, KINLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetATimes");
      free(kinls_mem);
      kinls_mem = NULL;
      return (KINLS_SUNLS_FAIL);
    }
  }

  /* If LS supports preconditioning, initialize pset/psol to NULL */
  if (LS->ops->setpreconditioner)
  {
    retval = SUNLinSolSetPreconditioner(LS, kin_mem, NULL, NULL);
    if (retval != SUN_SUCCESS)
    {
      KINProcessError(kin_mem, KINLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                      "Error in calling SUNLinSolSetPreconditioner");
      free(kinls_mem);
      kinls_mem = NULL;
      return (KINLS_SUNLS_FAIL);
    }
  }

  /* initialize tolerance scaling factor */
  kinls_mem->tol_fac = -ONE;

  /* set SUNMatrix pointer (can be NULL) */
  kinls_mem->J = A;

  /* Attach linear solver memory to integrator memory */
  kin_mem->kin_lmem = kinls_mem;

  return (KINLS_SUCCESS);
}